

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridCore.hpp
# Opt level: O3

vector<double,_std::allocator<double>_> * __thiscall
TasGrid::BaseCanonicalGrid::getSupport
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,BaseCanonicalGrid *this)

{
  MultiIndexSet *pMVar1;
  allocator_type local_11;
  value_type_conflict2 local_10;
  
  pMVar1 = &this->points;
  if ((this->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->points).indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pMVar1 = &this->needed;
  }
  local_10 = 2.0;
  ::std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,(long)pMVar1->cache_num_indexes * (long)this->num_dimensions,
             &local_10,&local_11);
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<double> getSupport() const{ return std::vector<double>(Utils::size_mult(getNumPoints(), getNumDimensions()), 2.0); }